

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderMouseCursor
               (ImVec2 base_pos,float base_scale,ImGuiMouseCursor mouse_cursor,ImU32 col_fill,
               ImU32 col_border,ImU32 col_shadow)

{
  bool bVar1;
  ImVec2 *pIVar2;
  ImFontAtlas *this;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  int in_XMM1_Da;
  ImTextureID tex_id;
  float scale;
  ImVec2 pos;
  ImVec2 uv [4];
  ImVec2 size;
  ImVec2 offset;
  ImFontAtlas *font_atlas;
  ImDrawList *draw_list;
  ImGuiViewportP *viewport;
  int n;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe28;
  int iVar3;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe2c;
  ImDrawList *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  float _x;
  ImVec2 *this_00;
  ImVec2 p_min;
  ImVec2 *user_texture_id;
  ImDrawList *in_stack_fffffffffffffe60;
  ImU32 col;
  ImVec2 *in_stack_fffffffffffffe70;
  ImVec2 *in_stack_fffffffffffffeb0;
  ImVec2 in_stack_fffffffffffffeb8;
  ImVec2 *in_stack_fffffffffffffec0;
  ImFontAtlas *this_01;
  ImFontAtlas *pIVar5;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  undefined1 local_e0 [24];
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 *local_90;
  int local_84;
  ImVec2 local_80;
  undefined1 local_78 [40];
  ImVec2 local_50;
  ImFontAtlas *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  int local_2c;
  ImGuiContext *local_28;
  int local_1c;
  undefined4 local_18;
  undefined4 local_14;
  int local_c;
  
  local_28 = GImGui;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_c = in_XMM1_Da;
  for (local_2c = 0; local_2c < (local_28->Viewports).Size; local_2c = local_2c + 1) {
    pIVar2 = (ImVec2 *)ImVector<ImGuiViewportP_*>::operator[](&local_28->Viewports,local_2c);
    local_38 = *pIVar2;
    local_40 = (ImVec2)GetForegroundDrawList((ImGuiViewport *)0x116ecd);
    local_48 = (*(ImDrawListSharedData **)((long)local_40 + 0x38))->Font->ContainerAtlas;
    ImVec2::ImVec2(&local_50);
    ImVec2::ImVec2((ImVec2 *)local_78 + 4);
    pIVar5 = (ImFontAtlas *)((ImVec2 *)local_78 + 4);
    this = (ImFontAtlas *)local_78;
    do {
      this_01 = this;
      ImVec2::ImVec2((ImVec2 *)this_01);
      this = (ImFontAtlas *)&this_01->TexID;
    } while (this != pIVar5);
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      (this,(ImGuiMouseCursor)((ulong)pIVar5 >> 0x20),(ImVec2 *)this_01,
                       in_stack_fffffffffffffec0,(ImVec2 *)in_stack_fffffffffffffeb8,
                       in_stack_fffffffffffffeb0);
    col = (ImU32)in_stack_fffffffffffffe70;
    if (bVar1) {
      local_80 = operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (ImVec2 *)0x116fb6);
      local_84 = local_c;
      local_90 = (ImVec2 *)local_48->TexID;
      ImDrawList::PushTextureID
                (in_stack_fffffffffffffe30,
                 (ImTextureID)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      pIVar2 = &local_a8;
      _x = 1.0;
      p_min = local_40;
      user_texture_id = local_90;
      ImVec2::ImVec2(pIVar2,1.0,0.0);
      local_a0 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           0.0);
      in_stack_fffffffffffffeb0 = &local_80;
      local_98 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (ImVec2 *)0x117076);
      this_00 = &local_c8;
      ImVec2::ImVec2(this_00,_x,0.0);
      local_c0 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (ImVec2 *)0x1170ba);
      local_b8 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           0.0);
      local_b0 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (ImVec2 *)0x1170f7);
      iVar3 = local_1c;
      ImDrawList::AddImage
                (in_stack_fffffffffffffe60,user_texture_id,(ImVec2 *)p_min,this_00,
                 (ImVec2 *)CONCAT44(_x,in_stack_fffffffffffffe40),pIVar2,col);
      in_stack_fffffffffffffe60 = (ImDrawList *)local_e0;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffe60,2.0,0.0);
      local_e0._8_8_ = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,iVar3),0.0);
      local_e0._16_8_ =
           operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,iVar3),(ImVec2 *)0x1171b6);
      in_stack_fffffffffffffe70 = &local_100;
      ImVec2::ImVec2(in_stack_fffffffffffffe70,2.0,0.0);
      local_f8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,iVar3),(ImVec2 *)0x1171f2);
      local_f0 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,iVar3),0.0);
      local_e8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,iVar3),(ImVec2 *)0x11722f);
      iVar3 = local_1c;
      ImDrawList::AddImage
                (in_stack_fffffffffffffe60,user_texture_id,(ImVec2 *)p_min,this_00,
                 (ImVec2 *)CONCAT44(_x,in_stack_fffffffffffffe40),pIVar2,
                 (ImU32)in_stack_fffffffffffffe70);
      operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,iVar3),0.0);
      operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,iVar3),(ImVec2 *)0x1172bb);
      uVar4 = local_18;
      ImDrawList::AddImage
                (in_stack_fffffffffffffe60,user_texture_id,(ImVec2 *)p_min,this_00,
                 (ImVec2 *)CONCAT44(_x,in_stack_fffffffffffffe40),pIVar2,
                 (ImU32)in_stack_fffffffffffffe70);
      in_stack_fffffffffffffeb8 = local_40;
      in_stack_fffffffffffffec0 = local_90;
      operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,uVar4),0.0);
      operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,uVar4),(ImVec2 *)0x11734d);
      in_stack_fffffffffffffe28 = local_14;
      ImDrawList::AddImage
                (in_stack_fffffffffffffe60,user_texture_id,(ImVec2 *)p_min,this_00,
                 (ImVec2 *)CONCAT44(_x,in_stack_fffffffffffffe40),pIVar2,
                 (ImU32)in_stack_fffffffffffffe70);
      ImDrawList::PopTextureID(in_stack_fffffffffffffe30);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImVec2 base_pos, float base_scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        ImDrawList* draw_list = GetForegroundDrawList(viewport);
        ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
        ImVec2 offset, size, uv[4];
        if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
        {
            const ImVec2 pos = base_pos - offset;
            const float scale = base_scale;
            ImTextureID tex_id = font_atlas->TexID;
            draw_list->PushTextureID(tex_id);
            draw_list->AddImage(tex_id, pos + ImVec2(1, 0) * scale, pos + (ImVec2(1, 0) + size) * scale, uv[2], uv[3], col_shadow);
            draw_list->AddImage(tex_id, pos + ImVec2(2, 0) * scale, pos + (ImVec2(2, 0) + size) * scale, uv[2], uv[3], col_shadow);
            draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[2], uv[3], col_border);
            draw_list->AddImage(tex_id, pos,                        pos + size * scale,                  uv[0], uv[1], col_fill);
            draw_list->PopTextureID();
        }
    }
}